

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readCustomSection(WasmBinaryReader *this,size_t payloadLen)

{
  bool bVar1;
  size_t payloadLen_00;
  size_type sVar2;
  const_iterator __first;
  const_iterator __last;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *this_00;
  allocator_type local_f1;
  vector<char,_std::allocator<char>_> local_f0;
  undefined1 local_d8 [8];
  string_view data;
  value_type *section;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80 [2];
  allocator<char> local_59;
  string local_58;
  ulong local_38;
  size_t read;
  Name sectionName;
  size_t oldPos;
  size_t payloadLen_local;
  WasmBinaryReader *this_local;
  
  sectionName.super_IString.str._M_str = (char *)this->pos;
  _read = (string_view)getInlineString(this,true);
  local_38 = this->pos - (long)sectionName.super_IString.str._M_str;
  if (local_38 <= payloadLen) {
    payloadLen_00 = payloadLen - local_38;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_80,BinaryConsts::CustomSections::Name);
    bVar1 = IString::equals((IString *)&read,local_80[0]);
    if (bVar1) {
      this->pos = payloadLen_00 + this->pos;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_90,BinaryConsts::CustomSections::TargetFeatures);
      bVar1 = IString::equals((IString *)&read,local_90);
      if (bVar1) {
        readFeatures(this,payloadLen_00);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a0,BinaryConsts::CustomSections::Dylink);
        bVar1 = IString::equals((IString *)&read,local_a0);
        if (bVar1) {
          readDylink(this,payloadLen_00);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_b0,BinaryConsts::CustomSections::Dylink0);
          bVar1 = IString::equals((IString *)&read,local_b0);
          if (bVar1) {
            readDylink0(this,payloadLen_00);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&section,
                       BinaryConsts::CustomSections::Linking);
            bVar1 = IString::equals((IString *)&read,_section);
            if (bVar1) {
              std::operator<<((ostream *)&std::cerr,
                              "warning: linking section is present, so this is not a standard wasm file - binaryen cannot handle this properly!\n"
                             );
            }
            this_00 = &this->wasm->customSections;
            sVar2 = std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::size
                              (this_00);
            std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::resize
                      (this_00,sVar2 + 1);
            data._M_str = (char *)std::
                                  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>
                                  ::back(&this->wasm->customSections);
            std::__cxx11::string::operator=
                      ((string *)data._M_str,
                       (basic_string_view<char,_std::char_traits<char>_> *)&read);
            _local_d8 = getByteView(this,payloadLen_00);
            __first = std::basic_string_view<char,_std::char_traits<char>_>::begin
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_d8);
            __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_d8);
            std::allocator<char>::allocator();
            std::vector<char,std::allocator<char>>::vector<char_const*,void>
                      ((vector<char,std::allocator<char>> *)&local_f0,__first,__last,&local_f1);
            std::vector<char,_std::allocator<char>_>::operator=
                      ((vector<char,_std::allocator<char>_> *)(data._M_str + 0x20),&local_f0);
            std::vector<char,_std::allocator<char>_>::~vector(&local_f0);
            std::allocator<char>::~allocator(&local_f1);
          }
        }
      }
    }
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"bad user section size",&local_59);
  throwError(this,&local_58);
}

Assistant:

void WasmBinaryReader::readCustomSection(size_t payloadLen) {
  auto oldPos = pos;
  Name sectionName = getInlineString();
  size_t read = pos - oldPos;
  if (read > payloadLen) {
    throwError("bad user section size");
  }
  payloadLen -= read;
  if (sectionName.equals(BinaryConsts::CustomSections::Name)) {
    // We already read the name section before anything else.
    pos += payloadLen;
  } else if (sectionName.equals(BinaryConsts::CustomSections::TargetFeatures)) {
    readFeatures(payloadLen);
  } else if (sectionName.equals(BinaryConsts::CustomSections::Dylink)) {
    readDylink(payloadLen);
  } else if (sectionName.equals(BinaryConsts::CustomSections::Dylink0)) {
    readDylink0(payloadLen);
  } else {
    // an unfamiliar custom section
    if (sectionName.equals(BinaryConsts::CustomSections::Linking)) {
      std::cerr
        << "warning: linking section is present, so this is not a standard "
           "wasm file - binaryen cannot handle this properly!\n";
    }
    wasm.customSections.resize(wasm.customSections.size() + 1);
    auto& section = wasm.customSections.back();
    section.name = sectionName.str;
    auto data = getByteView(payloadLen);
    section.data = {data.begin(), data.end()};
  }
}